

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O3

CURLcode cf_hc_query(Curl_cfilter *cf,Curl_easy *data,int query,int *pres1,void *pres2)

{
  Curl_cfilter *pCVar1;
  Curl_cfilter *pCVar2;
  _Bool _Var3;
  CURLcode CVar4;
  ulong uVar5;
  int query_00;
  curltime *when;
  ulong uVar6;
  curltime cVar7;
  
  if ((cf->field_0x24 & 1) == 0) {
    pCVar1 = (Curl_cfilter *)cf->ctx;
    if (query == 4) {
      query_00 = 4;
    }
    else {
      if (query != 5) {
        if ((query == 7) && (uVar5 = *(ulong *)&pCVar1[3].sockindex, uVar5 != 0)) {
          uVar6 = 0;
          pCVar2 = pCVar1;
          do {
            if ((pCVar2[1].next != (Curl_cfilter *)0x0) && (*(int *)&pCVar2[1].ctx == 0)) {
              _Var3 = Curl_conn_cf_needs_flush(pCVar2[1].next,data);
              if (_Var3) {
                *pres1 = 1;
                goto LAB_001153ab;
              }
              uVar5 = *(ulong *)&pCVar1[3].sockindex;
              query = 7;
            }
            uVar6 = uVar6 + 1;
            pCVar2 = (Curl_cfilter *)&pCVar2[1].ctx;
          } while (uVar6 < uVar5);
        }
        goto LAB_00115364;
      }
      query_00 = 5;
    }
    cVar7 = cf_get_max_baller_time(pCVar1,data,query_00);
    *(time_t *)pres2 = cVar7.tv_sec;
    *(int *)((long)pres2 + 8) = cVar7.tv_usec;
LAB_001153ab:
    CVar4 = CURLE_OK;
  }
  else {
LAB_00115364:
    pCVar1 = cf->next;
    if (pCVar1 != (Curl_cfilter *)0x0) {
      CVar4 = (*pCVar1->cft->query)(pCVar1,data,query,pres1,pres2);
      return CVar4;
    }
    CVar4 = CURLE_UNKNOWN_OPTION;
  }
  return CVar4;
}

Assistant:

static CURLcode cf_hc_query(struct Curl_cfilter *cf,
                            struct Curl_easy *data,
                            int query, int *pres1, void *pres2)
{
  struct cf_hc_ctx *ctx = cf->ctx;
  size_t i;

  if(!cf->connected) {
    switch(query) {
    case CF_QUERY_TIMER_CONNECT: {
      struct curltime *when = pres2;
      *when = cf_get_max_baller_time(cf, data, CF_QUERY_TIMER_CONNECT);
      return CURLE_OK;
    }
    case CF_QUERY_TIMER_APPCONNECT: {
      struct curltime *when = pres2;
      *when = cf_get_max_baller_time(cf, data, CF_QUERY_TIMER_APPCONNECT);
      return CURLE_OK;
    }
    case CF_QUERY_NEED_FLUSH: {
      for(i = 0; i < ctx->baller_count; i++)
        if(cf_hc_baller_needs_flush(&ctx->ballers[i], data)) {
          *pres1 = TRUE;
          return CURLE_OK;
        }
      break;
    }
    default:
      break;
    }
  }
  return cf->next ?
    cf->next->cft->query(cf->next, data, query, pres1, pres2) :
    CURLE_UNKNOWN_OPTION;
}